

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O2

link_map * get_vdso_from_auxv(void)

{
  link_map *plVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  
  parse_auxv_contents();
  if (vdso_ehdr != (Elf64_Ehdr *)0x0) {
    lVar3 = 0;
    for (lVar4 = 0; (ulong)vdso_ehdr->e_phnum * 0x38 - lVar4 != 0; lVar4 = lVar4 + 0x38) {
      if (*(int *)(vdso_ehdr->e_ident + lVar4 + vdso_ehdr->e_phoff) == 2) {
        lVar3 = *(long *)(vdso_ehdr->e_ident + lVar4 + vdso_ehdr->e_phoff + 0x10);
      }
    }
    pcVar2 = std::__throw_regex_error;
    while (plVar1 = *(link_map **)pcVar2, plVar1 != (link_map *)0x0) {
      if ((Elf64_Dyn *)(plVar1->l_addr + lVar3) == plVar1->l_ld) {
        return plVar1;
      }
      pcVar2 = (code *)&plVar1->l_next;
    }
  }
  return (link_map *)0x0;
}

Assistant:

struct link_map *get_vdso_from_auxv() {
  struct link_map *m = NULL;

  ElfW(Phdr) *vdso_phdrs = NULL;
  ElfW(Half) vdso_phdr_num, p;
  ElfW(Addr) vdso_dynamic = 0;

  parse_auxv_contents();
  if (vdso_ehdr) {
    vdso_phdrs =
        (ElfW(Phdr) *)(vdso_ehdr->e_phoff + ((unsigned char *)vdso_ehdr));
    vdso_phdr_num = vdso_ehdr->e_phnum;

    for (p = 0; p < vdso_phdr_num; p++) {
      if (vdso_phdrs[p].p_type == PT_DYNAMIC) {
        vdso_dynamic = (ElfW(Addr))vdso_phdrs[p].p_vaddr;
      }
    }

    for (m = _r_debug.r_map; m; m = m->l_next) {
      if (m->l_addr + vdso_dynamic == (ElfW(Addr))m->l_ld) {
        return m;
      }
    }
  }
  return NULL;  // GCOVR_EXCL_LINE
}